

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

void __thiscall soul::StructuralParser::parseStructDeclaration(StructuralParser *this)

{
  bool bVar1;
  StructDeclaration *this_00;
  ModuleBase *pMVar2;
  Expression *type;
  Identifier memberName;
  Identifier name;
  Context context;
  Context local_48;
  
  getContext(&context,this);
  name = parseIdentifier(this);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a351b);
  this_00 = allocate<soul::AST::StructDeclaration,soul::AST::Context&,soul::Identifier&>
                      (this,&context,&name);
  pMVar2 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
  local_48.location.sourceCode.object = (SourceCodeText *)this_00;
  std::
  vector<soul::pool_ref<soul::AST::StructDeclaration>,std::allocator<soul::pool_ref<soul::AST::StructDeclaration>>>
  ::emplace_back<soul::pool_ref<soul::AST::StructDeclaration>>
            ((vector<soul::pool_ref<soul::AST::StructDeclaration>,std::allocator<soul::pool_ref<soul::AST::StructDeclaration>>>
              *)&pMVar2->structures,(pool_ref<soul::AST::StructDeclaration> *)&local_48);
  while( true ) {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a1eb4);
    if (bVar1) break;
    type = parseType(this,structMember);
    do {
      getContext(&local_48,this);
      memberName = parseIdentifier(this);
      AST::StructDeclaration::addMember(this_00,type,&local_48,memberName);
      RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                ((RefCountedPtr<soul::SourceCodeText> *)&local_48);
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a3519);
    } while (bVar1);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a19e8);
  }
  giveErrorOnSemicolon(this);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&context);
  return;
}

Assistant:

void parseStructDeclaration()
    {
        auto context = getContext();
        auto name = parseIdentifier();
        expect (Operator::openBrace);

        auto& newStruct = allocate<AST::StructDeclaration> (context, name);
        module->structures.push_back (newStruct);

        while (! matchIf (Operator::closeBrace))
        {
            auto& type = parseType (ParseTypeContext::structMember);

            for (;;)
            {
                newStruct.addMember (type, getContext(), parseIdentifier());

                if (matchIf (Operator::comma))
                    continue;

                expect (Operator::semicolon);
                break;
            }
        }

        giveErrorOnSemicolon();
    }